

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
split<int>(vector<int,_std::allocator<int>_> *__return_storage_ptr__,string *s,char delim,
          function<int_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          *transform)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  istream *piVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  int local_1ec;
  string local_1e8 [8];
  string item;
  stringstream local_1b8 [8];
  stringstream ss;
  function<int_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *transform_local;
  char delim_local;
  string *s_local;
  vector<int,_std::allocator<int>_> *elems;
  
  trim(s);
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1b8,(string *)s,_Var2);
  std::__cxx11::string::string(local_1e8);
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1b8,local_1e8,delim);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) break;
    std::__cxx11::string::string((string *)&local_210,local_1e8);
    local_1ec = std::
                function<int_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                ::operator()(transform,&local_210);
    std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&local_1ec);
    std::__cxx11::string::~string((string *)&local_210);
  }
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<t> split(std::string& s, char delim, const std::function<t(std::string)>& transform) {
	trim(s);
	std::vector<t> elems;
	std::stringstream ss(s);
	std::string item;
	while (std::getline(ss, item, delim)){ elems.push_back(transform(item)); }
	return elems;
}